

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::BlockRequestAllowed
          (PeerManagerImpl *this,CBlockIndex *pindex)

{
  long lVar1;
  bool bVar2;
  Params *params;
  int64_t iVar3;
  CBlockIndex *in_RSI;
  CBlockIndex *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  CBlockIndex *in_stack_ffffffffffffffb0;
  CChain *in_stack_ffffffffffffffb8;
  CBlockIndex *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffac,(AnnotatedMixin<std::recursive_mutex> *)0x2c7595);
  ChainstateManager::ActiveChain
            ((ChainstateManager *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar2 = CChain::Contains(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (bVar2) {
    local_9 = true;
  }
  else {
    bVar2 = CBlockIndex::IsValid
                      (in_stack_ffffffffffffffc0,
                       (BlockStatus)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    local_9 = false;
    if ((bVar2) && (local_9 = false, *(long *)(*(long *)&in_RDI[1].nTime + 0xce8) != 0)) {
      params = (Params *)
               CBlockIndex::GetBlockTime
                         ((CBlockIndex *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      iVar3 = CBlockIndex::GetBlockTime
                        ((CBlockIndex *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      local_9 = false;
      if ((long)params - iVar3 < 0x278d00) {
        CChainParams::GetConsensus
                  ((CChainParams *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        iVar3 = GetBlockProofEquivalentTime
                          (in_RSI,in_RDI,(CBlockIndex *)CONCAT17(local_9,in_stack_ffffffffffffffd0),
                           params);
        local_9 = iVar3 < 0x278d00;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

bool PeerManagerImpl::BlockRequestAllowed(const CBlockIndex* pindex)
{
    AssertLockHeld(cs_main);
    if (m_chainman.ActiveChain().Contains(pindex)) return true;
    return pindex->IsValid(BLOCK_VALID_SCRIPTS) && (m_chainman.m_best_header != nullptr) &&
           (m_chainman.m_best_header->GetBlockTime() - pindex->GetBlockTime() < STALE_RELAY_AGE_LIMIT) &&
           (GetBlockProofEquivalentTime(*m_chainman.m_best_header, *pindex, *m_chainman.m_best_header, m_chainparams.GetConsensus()) < STALE_RELAY_AGE_LIMIT);
}